

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_256_256_38_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [32];
  uint8_t plaintext [32];
  uint8_t key [32];
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x80,(uint8_t *)0x0,(uint8_t *)0x0,(uint8_t *)0x0);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_256_256_38_1(void) {
  const uint8_t key[32]       = {0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[32] = {0xAB, 0xFF, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[32] = {0xB8, 0xF2, 0x0A, 0x88, 0x8A, 0x0A, 0x9E, 0xC4,
                                           0xE4, 0x95, 0xF1, 0xFB, 0x43, 0x9A, 0xBD, 0xDE,
                                           0x18, 0xC1, 0xD3, 0xD2, 0x9C, 0xF2, 0x0D, 0xF4,
                                           0xB1, 0x0A, 0x56, 0x7A, 0xA0, 0x2C, 0x72, 0x67};

  return lowmc_enc(&parameters_256_256_38, key, plaintext, ciphertext_expected);
}